

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O2

void __thiscall
ApprovalTests::ApprovalException::ApprovalException(ApprovalException *this,string *msg)

{
  *(undefined ***)this = &PTR__ApprovalException_001a17d8;
  ::std::__cxx11::string::string((string *)&this->message,(string *)msg);
  return;
}

Assistant:

ApprovalException::ApprovalException(const std::string& msg) : message(msg)
    {
    }